

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O0

int oss_parse_posix_tz(os_tzinfo_t *info,char *tz,size_t len,int west_is_positive)

{
  ushort **ppuVar1;
  char *pcVar2;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  int *in_RDI;
  os_tzrule_t dst_end;
  os_tzrule_t dst_start;
  int dst_ofs;
  int std_ofs;
  size_t dst_name_len;
  size_t std_name_len;
  char *dst_name;
  char *std_name;
  char *p;
  size_t *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 uVar3;
  undefined1 uVar4;
  os_tzrule_t *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  int local_24;
  long local_20;
  char *local_18;
  int *local_10;
  int local_4;
  
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_70,0,0x18);
  memset(&stack0xffffffffffffff78,0,0x18);
  if (local_18 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    while( true ) {
      uVar4 = false;
      if (local_20 != 0) {
        ppuVar1 = __ctype_b_loc();
        uVar4 = ((*ppuVar1)[(int)*local_18] & 0x2000) != 0;
      }
      if ((bool)uVar4 == false) break;
      local_18 = local_18 + 1;
      local_20 = local_20 + -1;
    }
    if (local_20 == 0) {
      local_4 = 0;
    }
    else {
      local_38 = local_18;
      local_30 = parse_zone_name(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                                 (char *)(ulong)CONCAT16(in_stack_ffffffffffffff76,
                                                         in_stack_ffffffffffffff70),
                                 in_stack_ffffffffffffff68);
      local_48 = (long)local_30 - (long)local_38;
      if (local_48 == 0) {
        local_4 = 0;
      }
      else {
        local_18 = local_30;
        local_18 = parse_offset(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                (size_t *)in_stack_ffffffffffffff78);
        if (local_18 == local_30) {
          local_4 = 0;
        }
        else {
          if (local_24 != 0) {
            local_54 = -local_54;
          }
          local_30 = local_18;
          if ((local_20 == 0) ||
             (local_18 = parse_zone_name(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78
                                         ,(char *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff76,
                                                                          in_stack_ffffffffffffff70)
                                                          ),in_stack_ffffffffffffff68),
             local_18 == local_30)) {
            local_58 = local_54;
          }
          else {
            local_40 = local_30;
            local_50 = (long)local_18 - (long)local_30;
            local_30 = local_18;
            local_18 = parse_offset(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                    (size_t *)in_stack_ffffffffffffff78);
            if (local_18 == local_30) {
              local_58 = local_54 + 0xe10;
            }
            else if (local_24 != 0) {
              local_58 = -local_58;
            }
          }
          if ((local_20 != 0) && (*local_18 == ',')) {
            local_30 = local_18 + 1;
            local_20 = local_20 + -1;
            local_18 = local_30;
            pcVar2 = parse_dst_rule(in_stack_ffffffffffffff78,
                                    (char *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff76,
                                                                    in_stack_ffffffffffffff70)),
                                    in_stack_ffffffffffffff68);
            if (pcVar2 == local_30) {
              return 0;
            }
            if ((local_20 == 0) || (*pcVar2 != ',')) {
              return 0;
            }
            local_30 = pcVar2 + 1;
            local_20 = local_20 + -1;
            local_18 = local_30;
            local_18 = parse_dst_rule(in_stack_ffffffffffffff78,
                                      (char *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff76,
                                                                      in_stack_ffffffffffffff70)),
                                      in_stack_ffffffffffffff68);
            if (local_18 == local_30) {
              return 0;
            }
          }
          while( true ) {
            uVar3 = false;
            if (local_20 != 0) {
              ppuVar1 = __ctype_b_loc();
              uVar3 = ((*ppuVar1)[(int)*local_18] & 0x2000) != 0;
            }
            if ((bool)uVar3 == false) break;
            local_18 = local_18 + 1;
          }
          if (local_20 == 0) {
            memset(local_10,0,0x5c);
            *local_10 = local_54;
            local_10[1] = local_58;
            parse_zone_name(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                            (char *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_ffffffffffffff70)),
                            in_stack_ffffffffffffff68);
            parse_zone_name(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                            (char *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_ffffffffffffff70)),
                            in_stack_ffffffffffffff68);
            *(undefined8 *)(local_10 + 10) = local_70;
            *(undefined8 *)(local_10 + 0xc) = local_68;
            *(undefined8 *)(local_10 + 0xe) = local_60;
            *(os_tzrule_t **)(local_10 + 0x10) = in_stack_ffffffffffffff78;
            *(char **)(local_10 + 0x12) = in_stack_ffffffffffffff80;
            *(int **)(local_10 + 0x14) = in_stack_ffffffffffffff88;
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int oss_parse_posix_tz(struct os_tzinfo_t *info, const char *tz, size_t len,
                       int west_is_positive)
{
    const char *p;
    const char *std_name = 0, *dst_name = 0;
    size_t std_name_len = 0, dst_name_len = 0;
    int std_ofs = 0, dst_ofs = 0;
    struct os_tzrule_t dst_start, dst_end;

    /* clear the daylight savings start/end dates */
    memset(&dst_start, 0, sizeof(dst_start));
    memset(&dst_end, 0, sizeof(dst_end));

    /* if there's no TZ string, return failure */
    if (tz == 0)
        return FALSE;

    /* skip leading spaces, just in case; if that leaves nothing, fail */
    for ( ; len != 0 && isspace(*tz) ; ++tz, --len) ;
    if (len == 0)
        return FALSE;

    /* parse the standard time name; if that's empty, fail */
    std_name = tz;
    tz = parse_zone_name(0, 0, tz, &len);
    if ((std_name_len = tz - std_name) == 0)
        return FALSE;

    /* parse the offset value */
    p = tz;
    if ((tz = parse_offset(&std_ofs, tz, &len)) == p)
        return FALSE;

    /* if we're using west-positive notation, convert to os_tzinfo_t specs */
    if (west_is_positive)
        std_ofs = -std_ofs;

    /* if we're not done, check for a daylight zone */
    p = tz;
    if (len != 0 && (tz = parse_zone_name(0, 0, tz, &len)) != p)
    {
        /* found a daylight zone name - note it */
        dst_name = p;
        dst_name_len = tz - p;
        
        /* 
         *   check for an optional offset value; if it's not present,
         *   daylight time is implicitly one hour ahead of standard time 
         */
        p = tz;
        if ((tz = parse_offset(&dst_ofs, tz, &len)) == p)
            dst_ofs = std_ofs + 60*60;
        else if (west_is_positive)
            dst_ofs = -dst_ofs;
    }
    else
    {
        /* there's no daylight zone, so just repeat the standard offset */
        dst_ofs = std_ofs;
    }

    /* check for the daylight time start/end dates */
    if (len != 0 && *tz == ',')
    {
        /* parse the start date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_start, tz, &len)) == p)
            return FALSE;

        /* if there's a start date, there has to be an end date */
        if (len == 0 || *tz != ',')
            return FALSE;

        /* parse the end date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_end, tz, &len)) == p)
            return FALSE;
    }
    
    /* we need to be done now, other than trailing spaces */
    for ( ; len != 0 && isspace(*tz) ; ++tz) ;
    if (len != 0)
        return FALSE;

    /* clear the result structure */
    memset(info, 0, sizeof(*info));

    /* set the offsets */
    info->std_ofs = std_ofs;
    info->dst_ofs = dst_ofs;

    /* copy the abbreviation strings */
    parse_zone_name(info->std_abbr, sizeof(info->std_abbr),
                    std_name, &std_name_len);
    parse_zone_name(info->dst_abbr, sizeof(info->dst_abbr),
                    dst_name, &dst_name_len);

    /* copy the daylight start/end rules */
    memcpy(&info->dst_start, &dst_start, sizeof(info->dst_start));
    memcpy(&info->dst_end, &dst_end, sizeof(info->dst_end));

    /* success */
    return TRUE;
}